

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O1

void check_op<std::greater_equal>(void)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  size_t __n;
  char *pcVar6;
  char *__s;
  long lVar7;
  AssertionResult gtest_ar;
  string_view rhs;
  string_view lhs;
  greater_equal<fmt::v5::basic_string_view<char>_> local_81;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  AssertHelper local_78;
  internal local_70 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  long local_60;
  char *local_58;
  basic_string_view<char> local_50;
  basic_string_view<char> local_40;
  
  local_60 = 0;
  do {
    __s = (&PTR_anon_var_dwarf_2fe69_001d5940)[local_60];
    lVar7 = 0;
    local_58 = __s;
    do {
      local_40.data_ = __s;
      sVar3 = strlen(__s);
      pcVar6 = *(char **)((long)&PTR_anon_var_dwarf_2fe69_001d5940 + lVar7);
      local_50.data_ = pcVar6;
      local_40.size_ = sVar3;
      sVar4 = strlen(pcVar6);
      __n = sVar4;
      if (sVar3 < sVar4) {
        __n = sVar3;
      }
      local_50.size_ = sVar4;
      if (__n == 0) {
        iVar2 = 0;
      }
      else {
        iVar2 = memcmp(__s,pcVar6,__n);
      }
      iVar5 = (uint)(sVar3 < sVar4) << 0x1f;
      if (sVar3 == sVar4) {
        iVar5 = 0;
      }
      if (iVar2 != 0) {
        iVar5 = iVar2;
      }
      local_80.ptr_._0_1_ = -1 < iVar5;
      local_78.data_._0_1_ =
           std::greater_equal<fmt::v5::basic_string_view<char>_>::operator()
                     (&local_81,&local_40,&local_50);
      testing::internal::CmpHelperEQ<bool,bool>
                (local_70,"Op<int>()(lhs.compare(rhs), 0)","Op<string_view>()(lhs, rhs)",
                 (bool *)&local_80,(bool *)&local_78);
      __s = local_58;
      if (local_70[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_80);
        pcVar6 = "";
        if (local_68.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = ((local_68.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
                   ,0x1aa,pcVar6);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if (local_80.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_80.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_80.ptr_ + 8))();
          }
          local_80.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0x18);
    local_60 = local_60 + 1;
  } while (local_60 != 3);
  return;
}

Assistant:

void check_op() {
  const char *inputs[] = {"foo", "fop", "fo"};
  std::size_t num_inputs = sizeof(inputs) / sizeof(*inputs);
  for (std::size_t i = 0; i < num_inputs; ++i) {
    for (std::size_t j = 0; j < num_inputs; ++j) {
      string_view lhs(inputs[i]), rhs(inputs[j]);
      EXPECT_EQ(Op<int>()(lhs.compare(rhs), 0), Op<string_view>()(lhs, rhs));
    }
  }
}